

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::ThreeAxisAngularAccelerometerSensor
          (ThreeAxisAngularAccelerometerSensor *this,ThreeAxisAngularAccelerometerSensor *other)

{
  ThreeAxisAngularAccelerometerPrivateAttributes *pTVar1;
  pointer pcVar2;
  ThreeAxisAngularAccelerometerPrivateAttributes *pTVar3;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisAngularAccelerometerSensor_00185ab0;
  pTVar3 = (ThreeAxisAngularAccelerometerPrivateAttributes *)operator_new(0xa8);
  pTVar1 = other->pimpl;
  (pTVar3->name)._M_dataplus._M_p = (pointer)&(pTVar3->name).field_2;
  pcVar2 = (pTVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pTVar3,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  iDynTree::Transform::Transform(&pTVar3->link_H_sensor,&pTVar1->link_H_sensor);
  pTVar3->parent_link_index = pTVar1->parent_link_index;
  (pTVar3->parent_link_name)._M_dataplus._M_p = (pointer)&(pTVar3->parent_link_name).field_2;
  pcVar2 = (pTVar1->parent_link_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar3->parent_link_name,pcVar2,
             pcVar2 + (pTVar1->parent_link_name)._M_string_length);
  this->pimpl = pTVar3;
  return;
}

Assistant:

ThreeAxisAngularAccelerometerSensor::ThreeAxisAngularAccelerometerSensor(const ThreeAxisAngularAccelerometerSensor& other):
    pimpl(new ThreeAxisAngularAccelerometerPrivateAttributes(*(other.pimpl)))
{

}